

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O3

shared_ptr<duckdb::ColumnStatistics,_true> __thiscall
duckdb::ColumnStatistics::CreateEmptyStats(ColumnStatistics *this,LogicalType *type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ColumnStatistics,_true> sVar1;
  undefined1 local_91;
  ColumnStatistics *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  LogicalType local_80;
  BaseStatistics local_68;
  
  LogicalType::LogicalType(&local_80,type);
  BaseStatistics::CreateEmpty(&local_68,&local_80);
  local_90 = (ColumnStatistics *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ColumnStatistics,std::allocator<duckdb::ColumnStatistics>,duckdb::BaseStatistics>
            (&local_88,&local_90,(allocator<duckdb::ColumnStatistics> *)&local_91,&local_68);
  *(ColumnStatistics **)&(this->stats).type = local_90;
  (this->stats).type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._M_pi;
  if ((element_type *)local_88._M_pi != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      UNLOCK();
      if ((element_type *)local_88._M_pi == (element_type *)0x0) goto LAB_010ccd2e;
    }
    else {
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
LAB_010ccd2e:
  BaseStatistics::~BaseStatistics(&local_68);
  LogicalType::~LogicalType(&local_80);
  sVar1.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::ColumnStatistics,_true>)
         sVar1.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ColumnStatistics> ColumnStatistics::CreateEmptyStats(const LogicalType &type) {
	return make_shared_ptr<ColumnStatistics>(BaseStatistics::CreateEmpty(type));
}